

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O1

void skill_init(def_skill *class_skill)

{
  obj *obj;
  short sVar1;
  unsigned_short uVar2;
  int iVar3;
  ulong uVar4;
  objdescr *poVar5;
  char cVar6;
  char **ppcVar7;
  def_skill *pdVar8;
  ulong uVar9;
  short *psVar10;
  
  memset(u.weapon_skills,0,0xa8);
  for (obj = invent; obj != (obj *)0x0; obj = obj->nobj) {
    iVar3 = weapon_type(obj);
    if (iVar3 != 0) {
      u.weapon_skills[iVar3].skill = '\x02';
    }
  }
  if ((ushort)urole.malenum < 0x161) {
    if ((urole.malenum == 0x15e) || (urole.malenum == 0x160)) {
      u.weapon_skills[0x1f].skill = '\x02';
    }
  }
  else if (urole.malenum == 0x161) {
    u.weapon_skills[0x22].skill = '\x02';
  }
  else if (urole.malenum == 0x168) {
    u.weapon_skills[0x1e].skill = '\x02';
    u.weapon_skills[0x21].skill = '\x02';
  }
  cVar6 = class_skill->skill;
  if (cVar6 != '\0') {
    pdVar8 = class_skill + 1;
    do {
      u.weapon_skills[cVar6].max_skill = pdVar8[-1].skmax;
      if (u.weapon_skills[cVar6].skill == '\0') {
        u.weapon_skills[cVar6].skill = '\x01';
      }
      cVar6 = pdVar8->skill;
      pdVar8 = pdVar8 + 1;
    } while (cVar6 != '\0');
  }
  if ('\x04' < u.weapon_skills[0x25].max_skill) {
    u.weapon_skills[0x25].skill = '\x02';
  }
  if (urole.petnum == 0x6b) {
    u.weapon_skills[0x27].skill = '\x02';
  }
  psVar10 = skill_names_indices;
  uVar9 = 0;
  do {
    cVar6 = u.weapon_skills[uVar9].skill;
    if (cVar6 != '\0') {
      if (u.weapon_skills[uVar9].max_skill < cVar6) {
        if ((0x2ffd7bfeUL >> (uVar9 & 0x3f) & 1) == 0) {
          if (uVar9 == 0x25) {
            uVar4 = (ulong)(urole.malenum == 0x160 || urole.malenum == 0x165);
            ppcVar7 = barehands_or_martial;
          }
          else {
            uVar4 = (ulong)(uint)-(int)*psVar10;
            ppcVar7 = odd_skill_names;
          }
          poVar5 = (objdescr *)(ppcVar7 + uVar4);
        }
        else {
          poVar5 = obj_descr + objects[*psVar10].oc_name_idx;
        }
        impossible("skill_init: curr > max: %s",poVar5->oc_name);
        u.weapon_skills[uVar9].max_skill = u.weapon_skills[uVar9].skill;
      }
      cVar6 = u.weapon_skills[uVar9].skill;
      sVar1 = cVar6 + -1;
      uVar2 = sVar1 * sVar1 * 0x14;
      if (6 < (int)uVar9 - 0x1eU) {
        uVar2 = (unsigned_short)(100 << (cVar6 - 2U & 0x1f));
      }
      u.weapon_skills[uVar9].advance = uVar2;
    }
    uVar9 = uVar9 + 1;
    psVar10 = psVar10 + 1;
  } while (uVar9 != 0x2a);
  return;
}

Assistant:

void skill_init(const struct def_skill *class_skill)
{
	struct obj *obj;
	int skmax, skill;

	/* initialize skill array; by default, everything is restricted */
	for (skill = 0; skill < P_NUM_SKILLS; skill++) {
	    P_SKILL(skill) = P_ISRESTRICTED;
	    P_MAX_SKILL(skill) = P_ISRESTRICTED;
	    P_ADVANCE(skill) = 0;
	}

	/* Set skill for all weapons in inventory to be basic */
	for (obj = invent; obj; obj = obj->nobj) {
	    skill = weapon_type(obj);
	    if (skill != P_NONE)
		P_SKILL(skill) = P_BASIC;
	}

	/* set skills for magic */
	if (Role_if (PM_HEALER) || Role_if(PM_MONK)) {
		P_SKILL(P_HEALING_SPELL) = P_BASIC;
	} else if (Role_if (PM_PRIEST)) {
		P_SKILL(P_CLERIC_SPELL) = P_BASIC;
	} else if (Role_if (PM_WIZARD)) {
		P_SKILL(P_ATTACK_SPELL) = P_BASIC;
		P_SKILL(P_ENCHANTMENT_SPELL) = P_BASIC;
	}

	/* walk through array to set skill maximums */
	for (; class_skill->skill != P_NONE; class_skill++) {
	    skmax = class_skill->skmax;
	    skill = class_skill->skill;

	    P_MAX_SKILL(skill) = skmax;
	    if (P_SKILL(skill) == P_ISRESTRICTED)	/* skill pre-set */
		P_SKILL(skill) = P_UNSKILLED;
	}

	/* High potential fighters already know how to use their hands. */
	if (P_MAX_SKILL(P_BARE_HANDED_COMBAT) > P_EXPERT)
	    P_SKILL(P_BARE_HANDED_COMBAT) = P_BASIC;

	/* Roles that start with a horse know how to ride it */
	if (urole.petnum == PM_PONY)
	    P_SKILL(P_RIDING) = P_BASIC;

	/*
	 * Make sure we haven't missed setting the max on a skill
	 * & set advance
	 */
	for (skill = 0; skill < P_NUM_SKILLS; skill++) {
	    if (!P_RESTRICTED(skill)) {
		if (P_MAX_SKILL(skill) < P_SKILL(skill)) {
		    impossible("skill_init: curr > max: %s", P_NAME(skill));
		    P_MAX_SKILL(skill) = P_SKILL(skill);
		}
		P_ADVANCE(skill) = practice_needed_to_advance(skill, P_SKILL(skill) - 1);
	    }
	}
}